

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_bundle.cpp
# Opt level: O0

void fe_bundle_free(fe_bundle *bundle)

{
  fe_effect *ef;
  int i;
  fe_bundle *bundle_local;
  
  for (ef._4_4_ = 0; ef._4_4_ < bundle->num; ef._4_4_ = ef._4_4_ + 1) {
    fe_effect_free(bundle->effect + ef._4_4_);
  }
  _fe_free(bundle->effect);
  _fe_free(bundle);
  return;
}

Assistant:

void fe_bundle_free(fe_bundle* bundle)
{
    for (int i = 0; i < bundle->num; ++i)
    {
        fe_effect* ef = &bundle->effect[i];
        fe_effect_free(ef);
    }

    _fe_free(bundle->effect);
    _fe_free(bundle);
}